

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O3

permInfo * setPermInfoPtr(int var)

{
  uint uVar1;
  permInfo *pi;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pi = (permInfo *)malloc(0x28);
  iVar5 = 0;
  pi->flipCtr = 0;
  pi->varN = var;
  uVar1 = ~(-1 << ((byte)var & 0x1f));
  pi->totalFlips = uVar1;
  pi->swapCtr = 0;
  if (1 < (uint)var) {
    uVar4 = var + 2;
    uVar7 = var - 2;
    iVar12 = var + -1;
    uVar13 = var - 2;
    iVar14 = var + -3;
    auVar11 = _DAT_00846650;
    iVar5 = 4;
    do {
      auVar8 = auVar11;
      auVar11._0_4_ = auVar8._0_4_ * var;
      auVar9._8_4_ = (undefined4)((auVar8._8_8_ & 0xffffffff) * (ulong)uVar13);
      auVar9._4_4_ = auVar9._8_4_;
      auVar9._0_4_ = auVar11._0_4_;
      auVar9._12_4_ = auVar8._12_4_ * iVar14;
      auVar11._8_8_ = auVar9._8_8_;
      auVar11._4_4_ = auVar8._4_4_ * iVar12;
      var = var + -4;
      iVar12 = iVar12 + -4;
      uVar13 = uVar13 - 4;
      iVar14 = iVar14 + -4;
      iVar3 = iVar5 + -4;
      iVar6 = iVar5 + (uVar4 & 0xfffffffc);
      iVar5 = iVar3;
    } while (iVar6 != 8);
    uVar4 = -iVar3;
    auVar10._0_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
    auVar10._4_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
    auVar10._8_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
    auVar10._12_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
    auVar11 = ~auVar10 & auVar11 | auVar8 & auVar10;
    iVar5 = auVar11._8_4_ * auVar11._0_4_ * auVar11._4_4_ * auVar11._12_4_ + -1;
  }
  pi->totalSwaps = iVar5;
  piVar2 = (int *)malloc((ulong)uVar1 << 2);
  pi->flipArray = piVar2;
  piVar2 = (int *)malloc((long)iVar5 << 2);
  pi->swapArray = piVar2;
  fillInSwapArray(pi);
  fillInFlipArray(pi);
  return pi;
}

Assistant:

permInfo* setPermInfoPtr(int var)
{
	permInfo* x;
	x = (permInfo*) malloc(sizeof(permInfo));
	x->flipCtr=0;
	x->varN = var; 
	x->totalFlips=(1<<var)-1;
	x->swapCtr=0;
	x->totalSwaps=factorial(var)-1;
	x->flipArray = (int*) malloc(sizeof(int)*x->totalFlips);
	x->swapArray = (int*) malloc(sizeof(int)*x->totalSwaps);
	fillInSwapArray(x);
	fillInFlipArray(x);
	return x;
}